

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O3

int nn_global_create_ep(nn_sock *sock,char *addr,int bind)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  nn_transport **ppnVar4;
  nn_transport *transport;
  
  if (addr != (char *)0x0) {
    sVar2 = strlen(addr);
    if (0x7f < sVar2) {
      return -0x24;
    }
    pcVar3 = strchr(addr,0x3a);
    if ((pcVar3 != (char *)0x0) && (pcVar3[1] == '/')) {
      if (pcVar3[2] != '/') {
        return -0x16;
      }
      if (nn_transports[0] == (nn_transport *)0x0) {
        return -0x5d;
      }
      ppnVar4 = nn_transports;
      transport = nn_transports[0];
      while( true ) {
        ppnVar4 = ppnVar4 + 1;
        __s = transport->name;
        sVar2 = strlen(__s);
        if ((sVar2 == (long)pcVar3 - (long)addr) &&
           (iVar1 = bcmp(__s,addr,(long)pcVar3 - (long)addr), iVar1 == 0)) break;
        transport = *ppnVar4;
        if (transport == (nn_transport *)0x0) {
          return -0x5d;
        }
      }
      iVar1 = nn_sock_add_ep(sock,transport,bind,pcVar3 + 3);
      return iVar1;
    }
  }
  return -0x16;
}

Assistant:

static int nn_global_create_ep (struct nn_sock *sock, const char *addr,
    int bind)
{
    int rc;
    const char *proto;
    const char *delim;
    size_t protosz;
    const struct nn_transport *tp;
    int i;

    /*  Check whether address is valid. */
    if (!addr)
        return -EINVAL;
    if (strlen (addr) >= NN_SOCKADDR_MAX)
        return -ENAMETOOLONG;

    /*  Separate the protocol and the actual address. */
    proto = addr;
    delim = strchr (addr, ':');
    if (!delim)
        return -EINVAL;
    if (delim [1] != '/' || delim [2] != '/')
        return -EINVAL;
    protosz = delim - addr;
    addr += protosz + 3;

    /*  Find the specified protocol. */
    tp = NULL;
    for (i = 0; ((tp = nn_transports[i]) != NULL); i++) {
        if (strlen (tp->name) == protosz &&
              memcmp (tp->name, proto, protosz) == 0)
            break;
    }

    /*  The protocol specified doesn't match any known protocol. */
    if (tp == NULL) {
        return -EPROTONOSUPPORT;
    }

    /*  Ask the socket to create the endpoint. */
    rc = nn_sock_add_ep (sock, tp, bind, addr);
    return rc;
}